

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall
leveldb::log::_Test_UnexpectedLastType::_Test_UnexpectedLastType(_Test_UnexpectedLastType *this)

{
  _Test_UnexpectedLastType *this_local;
  
  LogTest::LogTest(&this->super_LogTest);
  return;
}

Assistant:

TEST(LogTest, UnexpectedLastType) {
  Write("foo");
  SetByte(6, kLastType);
  FixChecksum(0, 3);
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(3, DroppedBytes());
  ASSERT_EQ("OK", MatchError("missing start"));
}